

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

knot_style ON_KnotVectorStyle(int order,int cv_count,double *knot)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_34;
  int degree;
  int i;
  double ktol;
  double delta;
  int knot_count;
  knot_style s;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  delta._4_4_ = unknown_knot_style;
  if ((((1 < order) && (order <= cv_count)) && (knot != (double *)0x0)) &&
     (knot[order + -2] < knot[cv_count + -1])) {
    iVar2 = order + cv_count + -2;
    dVar3 = ((knot[order + -1] - knot[order + -2]) + (knot[cv_count + -1] - knot[cv_count + -2])) *
            0.5;
    bVar1 = ON_IsKnotVectorClamped(order,cv_count,knot,2);
    if (bVar1) {
      if (order == cv_count) {
        delta._4_4_ = piecewise_bezier_knots;
      }
      else {
        delta._4_4_ = clamped_end_knots;
        local_34 = order + -1;
        while ((local_34 <= cv_count + -1 &&
               (ABS((knot[local_34] - knot[local_34 + -1]) - dVar3) <= dVar3 * 1e-06))) {
          local_34 = local_34 + 1;
        }
        if (local_34 < cv_count) {
          local_34 = order + -1;
          while (((local_34 < cv_count + -1 && (knot[local_34] == knot[local_34 + order + -1 + -1]))
                 && (!NAN(knot[local_34]) && !NAN(knot[local_34 + order + -1 + -1])))) {
            local_34 = order + -1 + local_34;
          }
          if (cv_count + -1 <= local_34) {
            delta._4_4_ = piecewise_bezier_knots;
          }
        }
        else {
          delta._4_4_ = quasi_uniform_knots;
        }
      }
    }
    else {
      delta._4_4_ = non_uniform_knots;
      local_34 = 1;
      while ((local_34 < iVar2 &&
             (ABS((knot[local_34] - knot[local_34 + -1]) - dVar3) <= dVar3 * 1e-06))) {
        local_34 = local_34 + 1;
      }
      if (iVar2 <= local_34) {
        delta._4_4_ = uniform_knots;
      }
    }
  }
  return delta._4_4_;
}

Assistant:

ON::knot_style ON_KnotVectorStyle( 
       int order,
       int cv_count,
       const double* knot
       )
{
  ON::knot_style s = ON::unknown_knot_style;
  if ( order >= 2 && cv_count >= order && knot && knot[order-2] < knot[cv_count-1] ) {
    const int knot_count = order+cv_count-2;
    const double delta = 0.5*((knot[order-1] - knot[order-2]) + (knot[cv_count-1] - knot[cv_count-2]));
    const double ktol = delta*1.0e-6;
    int i;
    if ( ON_IsKnotVectorClamped( order, cv_count, knot ) ) {
      if ( order == cv_count ) {
        s = ON::piecewise_bezier_knots;
      }
      else {
        s = ON::clamped_end_knots;
        for ( i = order-1; i <= cv_count-1; i++ ) {
          if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
            break;
          }
        }
        if ( i >= cv_count ) {
          s = ON::quasi_uniform_knots;
        }
        else {
          const int degree = order-1;
          for ( i = order-1; i < cv_count-1; i += degree ) {
            if ( knot[i] != knot[i+degree-1] )
              break; 
          }
          if ( i >= cv_count-1 )
            s = ON::piecewise_bezier_knots;
        }
      }
    }
    else {
      // check for uniform knots
      s = ON::non_uniform_knots;
      for ( i = 1; i < knot_count; i++ ) {
        if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
          break;
        }
      }
      if ( i >= knot_count )
        s = ON::uniform_knots; 
    }
  }
  return s;
}